

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O0

bool __thiscall
cmFunctionFunctionBlocker::IsFunctionBlocked
          (cmFunctionFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *param_3)

{
  int iVar1;
  char *pcVar2;
  cmFunctionHelperCommand *this_00;
  cmListFileContext *pcVar3;
  reference pvVar4;
  cmState *pcVar5;
  undefined1 local_70 [8];
  undefined1 local_68 [8];
  string newName;
  cmFunctionHelperCommand *f;
  cmExecutionStatus *param_3_local;
  cmMakefile *mf_local;
  cmListFileFunction *lff_local;
  cmFunctionFunctionBlocker *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"function");
  if (iVar1 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = cmsys::SystemTools::Strucmp(pcVar2,"endfunction");
    if (iVar1 == 0) {
      if (this->Depth == 0) {
        this_00 = (cmFunctionHelperCommand *)operator_new(0xc0);
        cmFunctionHelperCommand::cmFunctionHelperCommand(this_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this_00->Args,&this->Args);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::operator=
                  (&this_00->Functions,&this->Functions);
        pcVar3 = cmFunctionBlocker::GetStartingContext(&this->super_cmFunctionBlocker);
        std::__cxx11::string::operator=((string *)&this_00->FilePath,(string *)&pcVar3->FilePath);
        cmMakefile::RecordPolicies(mf,&this_00->Policies);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->Args,0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                       ,"_",pvVar4);
        pcVar5 = cmMakefile::GetState(mf);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->Args,0);
        cmState::RenameCommand(pcVar5,pvVar4,(string *)local_68);
        pcVar5 = cmMakefile::GetState(mf);
        cmState::AddCommand(pcVar5,(cmCommand *)this_00);
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_70,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        cmsys::auto_ptr<cmFunctionBlocker>::~auto_ptr((auto_ptr<cmFunctionBlocker> *)local_70);
        std::__cxx11::string::~string((string *)local_68);
        return true;
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmFunctionFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff, cmMakefile &mf,
                  cmExecutionStatus &)
{
  // record commands until we hit the ENDFUNCTION
  // at the ENDFUNCTION call we shift gears and start looking for invocations
  if(!cmSystemTools::Strucmp(lff.Name.c_str(),"function"))
    {
    this->Depth++;
    }
  else if(!cmSystemTools::Strucmp(lff.Name.c_str(),"endfunction"))
    {
    // if this is the endfunction for this function then execute
    if (!this->Depth)
      {
      // create a new command and add it to cmake
      cmFunctionHelperCommand *f = new cmFunctionHelperCommand();
      f->Args = this->Args;
      f->Functions = this->Functions;
      f->FilePath = this->GetStartingContext().FilePath;
      mf.RecordPolicies(f->Policies);

      std::string newName = "_" + this->Args[0];
      mf.GetState()->RenameCommand(this->Args[0], newName);
      mf.GetState()->AddCommand(f);

      // remove the function blocker now that the function is defined
      mf.RemoveFunctionBlocker(this, lff);
      return true;
      }
    else
      {
      // decrement for each nested function that ends
      this->Depth--;
      }
    }

  // if it wasn't an endfunction and we are not executing then we must be
  // recording
  this->Functions.push_back(lff);
  return true;
}